

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

void A_OverlayOffset(AActor *self,int layer,double wx,double wy,int flags)

{
  player_t *this;
  DPSprite *pDVar1;
  
  if (((((~flags & 3U) != 0) && (this = self->player, this != (player_t *)0x0)) &&
      (this->playerstate != '\x01')) &&
     (pDVar1 = player_t::FindPSprite(this,layer), pDVar1 != (DPSprite *)0x0)) {
    if ((flags & 1U) == 0) {
      if ((flags & 4U) != 0) {
        wx = wx + pDVar1->x;
      }
      pDVar1->x = wx;
    }
    if ((flags & 2U) == 0) {
      if ((flags & 4U) != 0) {
        wy = wy + pDVar1->y;
      }
      pDVar1->y = wy;
    }
  }
  return;
}

Assistant:

void A_OverlayOffset(AActor *self, int layer, double wx, double wy, int flags)
{
	if ((flags & WOF_KEEPX) && (flags & WOF_KEEPY))
	{
		return;
	}

	player_t *player = self->player;
	DPSprite *psp;

	if (player && (player->playerstate != PST_DEAD))
	{
		psp = player->FindPSprite(layer);

		if (psp == nullptr)
			return;

		if (!(flags & WOF_KEEPX))
		{
			if (flags & WOF_ADD)
			{
				psp->x += wx;
			}
			else
			{
				psp->x = wx;
			}
		}
		if (!(flags & WOF_KEEPY))
		{
			if (flags & WOF_ADD)
			{
				psp->y += wy;
			}
			else
			{
				psp->y = wy;
			}
		}
	}
}